

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_ssse3.c
# Opt level: O2

void av1_build_compound_diffwtd_mask_highbd_ssse3
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,uint8_t *src0,int src0_stride,
               uint8_t *src1,int src1_stride,int h,int w,int bd)

{
  short *psVar1;
  short *psVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int j;
  int iVar6;
  int iVar7;
  ulong uVar8;
  short sVar9;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  short sVar21;
  ushort uVar22;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ushort uVar32;
  
  auVar25 = _DAT_00465360;
  if (7 < w) {
    lVar3 = (long)src0 * 2;
    lVar4 = (long)src1 * 2;
    if (bd == 8) {
      iVar6 = 0;
      if (h < 1) {
        h = 0;
      }
      uVar5 = (ulong)(uint)w;
      if (mask_type == '\x01') {
        for (iVar6 = 0; iVar6 != h; iVar6 = iVar6 + 1) {
          for (uVar8 = 0; uVar8 < uVar5; uVar8 = uVar8 + 8) {
            psVar1 = (short *)(lVar3 + uVar8 * 2);
            psVar2 = (short *)(lVar4 + uVar8 * 2);
            auVar10._0_2_ = *psVar1 - *psVar2;
            auVar10._2_2_ = psVar1[1] - psVar2[1];
            auVar10._4_2_ = psVar1[2] - psVar2[2];
            auVar10._6_2_ = psVar1[3] - psVar2[3];
            auVar10._8_2_ = psVar1[4] - psVar2[4];
            auVar10._10_2_ = psVar1[5] - psVar2[5];
            auVar10._12_2_ = psVar1[6] - psVar2[6];
            auVar10._14_2_ = psVar1[7] - psVar2[7];
            auVar11 = pabsw(auVar10,auVar10);
            auVar11 = psraw(auVar11,4);
            sVar9 = auVar11._0_2_;
            sVar15 = auVar11._2_2_;
            sVar16 = auVar11._4_2_;
            sVar17 = auVar11._6_2_;
            sVar18 = auVar11._8_2_;
            sVar19 = auVar11._10_2_;
            sVar20 = auVar11._12_2_;
            sVar21 = auVar11._14_2_;
            auVar12._0_2_ =
                 ((ushort)(sVar9 < -0x26) * -0x26 | (ushort)(sVar9 >= -0x26) * sVar9) + 0x26;
            auVar12._2_2_ =
                 ((ushort)(sVar15 < -0x26) * -0x26 | (ushort)(sVar15 >= -0x26) * sVar15) + 0x26;
            auVar12._4_2_ =
                 ((ushort)(sVar16 < -0x26) * -0x26 | (ushort)(sVar16 >= -0x26) * sVar16) + 0x26;
            auVar12._6_2_ =
                 ((ushort)(sVar17 < -0x26) * -0x26 | (ushort)(sVar17 >= -0x26) * sVar17) + 0x26;
            auVar12._8_2_ =
                 ((ushort)(sVar18 < -0x26) * -0x26 | (ushort)(sVar18 >= -0x26) * sVar18) + 0x26;
            auVar12._10_2_ =
                 ((ushort)(sVar19 < -0x26) * -0x26 | (ushort)(sVar19 >= -0x26) * sVar19) + 0x26;
            auVar12._12_2_ =
                 ((ushort)(sVar20 < -0x26) * -0x26 | (ushort)(sVar20 >= -0x26) * sVar20) + 0x26;
            auVar12._14_2_ =
                 ((ushort)(sVar21 < -0x26) * -0x26 | (ushort)(sVar21 >= -0x26) * sVar21) + 0x26;
            auVar11 = psubusw(auVar25,auVar12);
            sVar9 = auVar11._0_2_;
            sVar15 = auVar11._2_2_;
            sVar16 = auVar11._4_2_;
            sVar17 = auVar11._6_2_;
            sVar18 = auVar11._8_2_;
            sVar19 = auVar11._10_2_;
            sVar20 = auVar11._12_2_;
            sVar21 = auVar11._14_2_;
            *(ulong *)(mask + uVar8) =
                 CONCAT17((0 < sVar21) * (sVar21 < 0x100) * auVar11[0xe] - (0xff < sVar21),
                          CONCAT16((0 < sVar20) * (sVar20 < 0x100) * auVar11[0xc] - (0xff < sVar20),
                                   CONCAT15((0 < sVar19) * (sVar19 < 0x100) * auVar11[10] -
                                            (0xff < sVar19),
                                            CONCAT14((0 < sVar18) * (sVar18 < 0x100) * auVar11[8] -
                                                     (0xff < sVar18),
                                                     CONCAT13((0 < sVar17) * (sVar17 < 0x100) *
                                                              auVar11[6] - (0xff < sVar17),
                                                              CONCAT12((0 < sVar16) *
                                                                       (sVar16 < 0x100) * auVar11[4]
                                                                       - (0xff < sVar16),
                                                                       CONCAT11((0 < sVar15) *
                                                                                (sVar15 < 0x100) *
                                                                                auVar11[2] -
                                                                                (0xff < sVar15),
                                                                                (0 < sVar9) *
                                                                                (sVar9 < 0x100) *
                                                                                auVar11[0] -
                                                                                (0xff < sVar9)))))))
                         );
          }
          mask = mask + uVar5;
          lVar4 = lVar4 + (long)src1_stride * 2;
          lVar3 = lVar3 + (long)src0_stride * 2;
        }
      }
      else {
        for (; iVar6 != h; iVar6 = iVar6 + 1) {
          for (uVar8 = 0; uVar8 < uVar5; uVar8 = uVar8 + 8) {
            psVar1 = (short *)(lVar3 + uVar8 * 2);
            psVar2 = (short *)(lVar4 + uVar8 * 2);
            auVar13._0_2_ = *psVar1 - *psVar2;
            auVar13._2_2_ = psVar1[1] - psVar2[1];
            auVar13._4_2_ = psVar1[2] - psVar2[2];
            auVar13._6_2_ = psVar1[3] - psVar2[3];
            auVar13._8_2_ = psVar1[4] - psVar2[4];
            auVar13._10_2_ = psVar1[5] - psVar2[5];
            auVar13._12_2_ = psVar1[6] - psVar2[6];
            auVar13._14_2_ = psVar1[7] - psVar2[7];
            auVar11 = pabsw(auVar13,auVar13);
            auVar11 = psraw(auVar11,4);
            sVar9 = auVar11._0_2_;
            sVar15 = auVar11._2_2_;
            sVar16 = auVar11._4_2_;
            sVar17 = auVar11._6_2_;
            sVar18 = auVar11._8_2_;
            sVar19 = auVar11._10_2_;
            sVar20 = auVar11._12_2_;
            sVar21 = auVar11._14_2_;
            auVar14._0_2_ =
                 ((ushort)(sVar9 < -0x26) * -0x26 | (ushort)(sVar9 >= -0x26) * sVar9) + 0x26;
            auVar14._2_2_ =
                 ((ushort)(sVar15 < -0x26) * -0x26 | (ushort)(sVar15 >= -0x26) * sVar15) + 0x26;
            auVar14._4_2_ =
                 ((ushort)(sVar16 < -0x26) * -0x26 | (ushort)(sVar16 >= -0x26) * sVar16) + 0x26;
            auVar14._6_2_ =
                 ((ushort)(sVar17 < -0x26) * -0x26 | (ushort)(sVar17 >= -0x26) * sVar17) + 0x26;
            auVar14._8_2_ =
                 ((ushort)(sVar18 < -0x26) * -0x26 | (ushort)(sVar18 >= -0x26) * sVar18) + 0x26;
            auVar14._10_2_ =
                 ((ushort)(sVar19 < -0x26) * -0x26 | (ushort)(sVar19 >= -0x26) * sVar19) + 0x26;
            auVar14._12_2_ =
                 ((ushort)(sVar20 < -0x26) * -0x26 | (ushort)(sVar20 >= -0x26) * sVar20) + 0x26;
            auVar14._14_2_ =
                 ((ushort)(sVar21 < -0x26) * -0x26 | (ushort)(sVar21 >= -0x26) * sVar21) + 0x26;
            auVar11 = psubusw(auVar14,auVar25);
            sVar9 = auVar14._0_2_ - auVar11._0_2_;
            sVar15 = auVar14._2_2_ - auVar11._2_2_;
            sVar16 = auVar14._4_2_ - auVar11._4_2_;
            sVar17 = auVar14._6_2_ - auVar11._6_2_;
            sVar18 = auVar14._8_2_ - auVar11._8_2_;
            sVar19 = auVar14._10_2_ - auVar11._10_2_;
            sVar20 = auVar14._12_2_ - auVar11._12_2_;
            sVar21 = auVar14._14_2_ - auVar11._14_2_;
            *(ulong *)(mask + uVar8) =
                 CONCAT17((0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21),
                          CONCAT16((0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20),
                                   CONCAT15((0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 -
                                            (0xff < sVar19),
                                            CONCAT14((0 < sVar18) * (sVar18 < 0x100) * (char)sVar18
                                                     - (0xff < sVar18),
                                                     CONCAT13((0 < sVar17) * (sVar17 < 0x100) *
                                                              (char)sVar17 - (0xff < sVar17),
                                                              CONCAT12((0 < sVar16) *
                                                                       (sVar16 < 0x100) *
                                                                       (char)sVar16 -
                                                                       (0xff < sVar16),
                                                                       CONCAT11((0 < sVar15) *
                                                                                (sVar15 < 0x100) *
                                                                                (char)sVar15 -
                                                                                (0xff < sVar15),
                                                                                (0 < sVar9) *
                                                                                (sVar9 < 0x100) *
                                                                                (char)sVar9 -
                                                                                (0xff < sVar9)))))))
                         );
          }
          mask = mask + uVar5;
          lVar4 = lVar4 + (long)src1_stride * 2;
          lVar3 = lVar3 + (long)src0_stride * 2;
        }
      }
    }
    else {
      iVar6 = bd + -4;
      iVar7 = 0;
      if (h < 1) {
        h = 0;
      }
      auVar11._0_8_ = (long)iVar6;
      auVar11._8_4_ = iVar6;
      auVar11._12_4_ = iVar6 >> 0x1f;
      uVar5 = (ulong)(uint)w;
      if (mask_type == '\x01') {
        for (iVar6 = 0; iVar6 != h; iVar6 = iVar6 + 1) {
          for (uVar8 = 0; uVar8 < uVar5; uVar8 = uVar8 + 8) {
            psVar1 = (short *)(lVar3 + uVar8 * 2);
            psVar2 = (short *)(lVar4 + uVar8 * 2);
            auVar23._0_2_ = *psVar1 - *psVar2;
            auVar23._2_2_ = psVar1[1] - psVar2[1];
            auVar23._4_2_ = psVar1[2] - psVar2[2];
            auVar23._6_2_ = psVar1[3] - psVar2[3];
            auVar23._8_2_ = psVar1[4] - psVar2[4];
            auVar23._10_2_ = psVar1[5] - psVar2[5];
            auVar23._12_2_ = psVar1[6] - psVar2[6];
            auVar23._14_2_ = psVar1[7] - psVar2[7];
            auVar23 = pabsw(auVar23,auVar23);
            auVar23 = psraw(auVar23,auVar11);
            sVar9 = auVar23._0_2_ + 0x26;
            sVar15 = auVar23._2_2_ + 0x26;
            sVar16 = auVar23._4_2_ + 0x26;
            sVar17 = auVar23._6_2_ + 0x26;
            sVar18 = auVar23._8_2_ + 0x26;
            sVar19 = auVar23._10_2_ + 0x26;
            sVar20 = auVar23._12_2_ + 0x26;
            sVar21 = auVar23._14_2_ + 0x26;
            auVar24._2_2_ = (ushort)(-1 < sVar15) * sVar15;
            auVar24._0_2_ = (ushort)(-1 < sVar9) * sVar9;
            auVar24._4_2_ = (ushort)(-1 < sVar16) * sVar16;
            auVar24._6_2_ = (ushort)(-1 < sVar17) * sVar17;
            auVar24._8_2_ = (ushort)(-1 < sVar18) * sVar18;
            auVar24._10_2_ = (ushort)(-1 < sVar19) * sVar19;
            auVar24._12_2_ = (ushort)(-1 < sVar20) * sVar20;
            auVar24._14_2_ = (ushort)(-1 < sVar21) * sVar21;
            auVar23 = psubusw(auVar25,auVar24);
            sVar9 = auVar23._0_2_;
            sVar15 = auVar23._2_2_;
            sVar16 = auVar23._4_2_;
            sVar17 = auVar23._6_2_;
            sVar18 = auVar23._8_2_;
            sVar19 = auVar23._10_2_;
            sVar20 = auVar23._12_2_;
            sVar21 = auVar23._14_2_;
            *(ulong *)(mask + uVar8) =
                 CONCAT17((0 < sVar21) * (sVar21 < 0x100) * auVar23[0xe] - (0xff < sVar21),
                          CONCAT16((0 < sVar20) * (sVar20 < 0x100) * auVar23[0xc] - (0xff < sVar20),
                                   CONCAT15((0 < sVar19) * (sVar19 < 0x100) * auVar23[10] -
                                            (0xff < sVar19),
                                            CONCAT14((0 < sVar18) * (sVar18 < 0x100) * auVar23[8] -
                                                     (0xff < sVar18),
                                                     CONCAT13((0 < sVar17) * (sVar17 < 0x100) *
                                                              auVar23[6] - (0xff < sVar17),
                                                              CONCAT12((0 < sVar16) *
                                                                       (sVar16 < 0x100) * auVar23[4]
                                                                       - (0xff < sVar16),
                                                                       CONCAT11((0 < sVar15) *
                                                                                (sVar15 < 0x100) *
                                                                                auVar23[2] -
                                                                                (0xff < sVar15),
                                                                                (0 < sVar9) *
                                                                                (sVar9 < 0x100) *
                                                                                auVar23[0] -
                                                                                (0xff < sVar9)))))))
                         );
          }
          mask = mask + uVar5;
          lVar4 = lVar4 + (long)src1_stride * 2;
          lVar3 = lVar3 + (long)src0_stride * 2;
        }
      }
      else {
        for (; iVar7 != h; iVar7 = iVar7 + 1) {
          for (uVar8 = 0; uVar8 < uVar5; uVar8 = uVar8 + 8) {
            psVar1 = (short *)(lVar3 + uVar8 * 2);
            psVar2 = (short *)(lVar4 + uVar8 * 2);
            auVar25._0_2_ = *psVar1 - *psVar2;
            auVar25._2_2_ = psVar1[1] - psVar2[1];
            auVar25._4_2_ = psVar1[2] - psVar2[2];
            auVar25._6_2_ = psVar1[3] - psVar2[3];
            auVar25._8_2_ = psVar1[4] - psVar2[4];
            auVar25._10_2_ = psVar1[5] - psVar2[5];
            auVar25._12_2_ = psVar1[6] - psVar2[6];
            auVar25._14_2_ = psVar1[7] - psVar2[7];
            auVar25 = pabsw(auVar25,auVar25);
            auVar25 = psraw(auVar25,auVar11);
            sVar21 = auVar25._0_2_ + 0x26;
            sVar9 = auVar25._2_2_ + 0x26;
            sVar15 = auVar25._4_2_ + 0x26;
            sVar16 = auVar25._6_2_ + 0x26;
            sVar17 = auVar25._8_2_ + 0x26;
            sVar18 = auVar25._10_2_ + 0x26;
            sVar19 = auVar25._12_2_ + 0x26;
            sVar20 = auVar25._14_2_ + 0x26;
            sVar21 = (ushort)(-1 < sVar21) * sVar21;
            sVar9 = (ushort)(-1 < sVar9) * sVar9;
            sVar15 = (ushort)(-1 < sVar15) * sVar15;
            sVar16 = (ushort)(-1 < sVar16) * sVar16;
            sVar17 = (ushort)(-1 < sVar17) * sVar17;
            sVar18 = (ushort)(-1 < sVar18) * sVar18;
            sVar19 = (ushort)(-1 < sVar19) * sVar19;
            sVar20 = (ushort)(-1 < sVar20) * sVar20;
            uVar22 = (ushort)(0x40 < sVar21) * 0x40 | (ushort)(0x40 >= sVar21) * sVar21;
            uVar26 = (ushort)(0x40 < sVar9) * 0x40 | (ushort)(0x40 >= sVar9) * sVar9;
            uVar27 = (ushort)(0x40 < sVar15) * 0x40 | (ushort)(0x40 >= sVar15) * sVar15;
            uVar28 = (ushort)(0x40 < sVar16) * 0x40 | (ushort)(0x40 >= sVar16) * sVar16;
            uVar29 = (ushort)(0x40 < sVar17) * 0x40 | (ushort)(0x40 >= sVar17) * sVar17;
            uVar30 = (ushort)(0x40 < sVar18) * 0x40 | (ushort)(0x40 >= sVar18) * sVar18;
            uVar31 = (ushort)(0x40 < sVar19) * 0x40 | (ushort)(0x40 >= sVar19) * sVar19;
            uVar32 = (ushort)(0x40 < sVar20) * 0x40 | (ushort)(0x40 >= sVar20) * sVar20;
            *(ulong *)(mask + uVar8) =
                 CONCAT17((0 < (short)uVar32) * ((short)uVar32 < 0x100) * (char)uVar32 -
                          (0xff < (short)uVar32),
                          CONCAT16((0 < (short)uVar31) * ((short)uVar31 < 0x100) * (char)uVar31 -
                                   (0xff < (short)uVar31),
                                   CONCAT15((0 < (short)uVar30) * ((short)uVar30 < 0x100) *
                                            (char)uVar30 - (0xff < (short)uVar30),
                                            CONCAT14((0 < (short)uVar29) * ((short)uVar29 < 0x100) *
                                                     (char)uVar29 - (0xff < (short)uVar29),
                                                     CONCAT13((0 < (short)uVar28) *
                                                              ((short)uVar28 < 0x100) * (char)uVar28
                                                              - (0xff < (short)uVar28),
                                                              CONCAT12((0 < (short)uVar27) *
                                                                       ((short)uVar27 < 0x100) *
                                                                       (char)uVar27 -
                                                                       (0xff < (short)uVar27),
                                                                       CONCAT11((0 < (short)uVar26)
                                                                                * ((short)uVar26 <
                                                                                  0x100) *
                                                                                (char)uVar26 -
                                                                                (0xff < (short)
                                                  uVar26),(0 < (short)uVar22) *
                                                          ((short)uVar22 < 0x100) * (char)uVar22 -
                                                          (0xff < (short)uVar22))))))));
          }
          mask = mask + uVar5;
          lVar4 = lVar4 + (long)src1_stride * 2;
          lVar3 = lVar3 + (long)src0_stride * 2;
        }
      }
    }
    return;
  }
  av1_build_compound_diffwtd_mask_highbd_c(mask,mask_type,src0,src0_stride,src1,src1_stride,h,w,bd);
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_highbd_ssse3(
    uint8_t *mask, DIFFWTD_MASK_TYPE mask_type, const uint8_t *src0,
    int src0_stride, const uint8_t *src1, int src1_stride, int h, int w,
    int bd) {
  if (w < 8) {
    av1_build_compound_diffwtd_mask_highbd_c(mask, mask_type, src0, src0_stride,
                                             src1, src1_stride, h, w, bd);
  } else {
    assert(bd >= 8);
    assert((w % 8) == 0);
    assert(mask_type == DIFFWTD_38 || mask_type == DIFFWTD_38_INV);
    const __m128i x0 = _mm_setzero_si128();
    const __m128i xAOM_BLEND_A64_MAX_ALPHA =
        _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
    const int mask_base = 38;
    const __m128i xmask_base = _mm_set1_epi16(mask_base);
    const uint16_t *ssrc0 = CONVERT_TO_SHORTPTR(src0);
    const uint16_t *ssrc1 = CONVERT_TO_SHORTPTR(src1);
    if (bd == 8) {
      if (mask_type == DIFFWTD_38_INV) {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 8) {
            __m128i s0 = _mm_loadu_si128((const __m128i *)&ssrc0[j]);
            __m128i s1 = _mm_loadu_si128((const __m128i *)&ssrc1[j]);
            __m128i diff = _mm_srai_epi16(_mm_abs_epi16(_mm_sub_epi16(s0, s1)),
                                          DIFF_FACTOR_LOG2);
            __m128i m = _mm_min_epi16(
                _mm_max_epi16(x0, _mm_add_epi16(diff, xmask_base)),
                xAOM_BLEND_A64_MAX_ALPHA);
            m = _mm_sub_epi16(xAOM_BLEND_A64_MAX_ALPHA, m);
            m = _mm_packus_epi16(m, m);
            _mm_storel_epi64((__m128i *)&mask[j], m);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      } else {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 8) {
            __m128i s0 = _mm_loadu_si128((const __m128i *)&ssrc0[j]);
            __m128i s1 = _mm_loadu_si128((const __m128i *)&ssrc1[j]);
            __m128i diff = _mm_srai_epi16(_mm_abs_epi16(_mm_sub_epi16(s0, s1)),
                                          DIFF_FACTOR_LOG2);
            __m128i m = _mm_min_epi16(
                _mm_max_epi16(x0, _mm_add_epi16(diff, xmask_base)),
                xAOM_BLEND_A64_MAX_ALPHA);
            m = _mm_packus_epi16(m, m);
            _mm_storel_epi64((__m128i *)&mask[j], m);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      }
    } else {
      const __m128i xshift = _mm_set1_epi64x(bd - 8 + DIFF_FACTOR_LOG2);
      if (mask_type == DIFFWTD_38_INV) {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 8) {
            __m128i s0 = _mm_loadu_si128((const __m128i *)&ssrc0[j]);
            __m128i s1 = _mm_loadu_si128((const __m128i *)&ssrc1[j]);
            __m128i diff =
                _mm_sra_epi16(_mm_abs_epi16(_mm_sub_epi16(s0, s1)), xshift);
            __m128i m = _mm_min_epi16(
                _mm_max_epi16(x0, _mm_add_epi16(diff, xmask_base)),
                xAOM_BLEND_A64_MAX_ALPHA);
            m = _mm_sub_epi16(xAOM_BLEND_A64_MAX_ALPHA, m);
            m = _mm_packus_epi16(m, m);
            _mm_storel_epi64((__m128i *)&mask[j], m);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      } else {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 8) {
            __m128i s0 = _mm_loadu_si128((const __m128i *)&ssrc0[j]);
            __m128i s1 = _mm_loadu_si128((const __m128i *)&ssrc1[j]);
            __m128i diff =
                _mm_sra_epi16(_mm_abs_epi16(_mm_sub_epi16(s0, s1)), xshift);
            __m128i m = _mm_min_epi16(
                _mm_max_epi16(x0, _mm_add_epi16(diff, xmask_base)),
                xAOM_BLEND_A64_MAX_ALPHA);
            m = _mm_packus_epi16(m, m);
            _mm_storel_epi64((__m128i *)&mask[j], m);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      }
    }
  }
}